

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtCofactor1p(word *pOut,word *pIn,int nWords,int iVar)

{
  word *pwVar1;
  word wVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  word *pwVar8;
  
  bVar3 = (byte)iVar;
  if (nWords != 1) {
    if (iVar < 6) {
      uVar7 = 0;
      uVar4 = (ulong)(uint)nWords;
      if (nWords < 1) {
        uVar4 = uVar7;
      }
      for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        pOut[uVar7] = (s_Truths6[iVar] & pIn[uVar7]) >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
                      s_Truths6[iVar] & pIn[uVar7];
      }
    }
    else {
      uVar5 = 1 << (bVar3 - 6 & 0x1f);
      pwVar1 = pIn + nWords;
      iVar6 = 2 << (bVar3 - 6 & 0x1f);
      uVar4 = 0;
      if (0 < (int)uVar5) {
        uVar4 = (ulong)uVar5;
      }
      pwVar8 = pIn + (int)uVar5;
      for (; pIn < pwVar1; pIn = pIn + iVar6) {
        for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          wVar2 = pwVar8[uVar7];
          pOut[uVar7] = wVar2;
          pOut[(long)(int)uVar5 + uVar7] = wVar2;
        }
        pOut = pOut + iVar6;
        pwVar8 = pwVar8 + iVar6;
      }
    }
    return;
  }
  *pOut = (s_Truths6[iVar] & *pIn) >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) | s_Truths6[iVar] & *pIn;
  return;
}

Assistant:

static inline void Abc_TtCofactor1p( word * pOut, word * pIn, int nWords, int iVar )
{
    if ( nWords == 1 )
        pOut[0] = (pIn[0] & s_Truths6[iVar]) | ((pIn[0] & s_Truths6[iVar]) >> (1 << iVar));
	else if ( iVar <= 5 )
	{
		int w, shift = (1 << iVar);
		for ( w = 0; w < nWords; w++ )
            pOut[w] = (pIn[w] & s_Truths6[iVar]) | ((pIn[w] & s_Truths6[iVar]) >> shift);
	}
	else // if ( iVar > 5 )
	{
        word * pLimit = pIn + nWords;
		int i, iStep = Abc_TtWordNum(iVar);
		for ( ; pIn < pLimit; pIn += 2*iStep, pOut += 2*iStep )
			for ( i = 0; i < iStep; i++ )
            {
                pOut[i]         = pIn[i + iStep];
                pOut[i + iStep] = pIn[i + iStep];
            }
	}	
}